

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O2

void __thiscall
Projection::initialSyncProject
          (Projection *this,int c_lev,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *sig,Real dt,Real strt_time,
          int have_divu)

{
  IntVect *this_00;
  int f_lev;
  unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> uVar1;
  FabArray<amrex::FArrayBox> *pFVar2;
  StateData *this_01;
  FabArrayBase *fabarray_;
  AmrLevel *pAVar3;
  pointer puVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  ostream *poVar8;
  MultiFab *this_02;
  NavierStokesBase *pNVar9;
  FabArray<amrex::FArrayBox> *pFVar10;
  FabArray<amrex::FArrayBox> *this_03;
  int *piVar11;
  long lVar12;
  long lVar13;
  BoxArray *pBVar14;
  MultiFab *pMVar15;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar16;
  undefined8 extraout_RDX_03;
  long lVar17;
  long lVar18;
  long lVar19;
  BoxArray *pBVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  BoxArray *pBVar25;
  BoxArray *pBVar26;
  long lVar27;
  double dVar28;
  Real RVar29;
  double dVar30;
  int Divu_Type;
  int local_4b8;
  int local_4b4;
  BoxArray *local_4b0;
  Real local_4a8;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_4a0;
  BoxArray *local_498;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> vel;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  rhcc;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> phi;
  Box local_3e0;
  int Divu;
  undefined1 local_3c0 [24];
  pointer local_3a8;
  __uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  _Stack_3a0;
  int local_398;
  MFIter mfi;
  int local_2b4;
  Array4<double> local_1f8;
  MultiFab v_fine;
  
  f_lev = *(int *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  lVar7 = (long)f_lev;
  local_4b8 = c_lev;
  local_4b4 = have_divu;
  local_4a0 = sig;
  if (verbose != 0) {
    poVar8 = amrex::OutStream();
    amrex::Print::Print((Print *)&mfi,poVar8);
    this_00 = &mfi.tile_size;
    std::operator<<((ostream *)this_00,"Projection::initialSyncProject(): levels = ");
    std::ostream::operator<<(this_00,local_4b8);
    std::operator<<((ostream *)this_00," - ");
    std::ostream::operator<<(this_00,f_lev);
    std::operator<<((ostream *)this_00,'\n');
    amrex::Print::~Print((Print *)&mfi);
    if ((verbose != 0) && ((anonymous_namespace)::benchmarking == '\x01')) {
      amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
    }
  }
  dVar28 = amrex::ParallelDescriptor::second();
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            (&vel.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,10,
             (value_type *)&mfi,(allocator_type *)&v_fine);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  pBVar14 = (BoxArray *)&v_fine;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            (&phi.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,10,
             (value_type *)&mfi,(allocator_type *)pBVar14);
  pBVar26 = (BoxArray *)(long)local_4b8;
  for (pBVar20 = pBVar26; (long)pBVar20 <= lVar7;
      pBVar20 = (BoxArray *)((long)&(pBVar20->m_bat).m_bat_type + 1)) {
    vel.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[(long)pBVar20] =
         *(MultiFab **)
          (*(long *)&((this->LevelData).
                      super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                      super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[(long)pBVar20]->state).
                     super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                     super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_> + 200);
    phi.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[(long)pBVar20] =
         *(MultiFab **)
          (*(long *)&((this->LevelData).
                      super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                      super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[(long)pBVar20]->state).
                     super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                     super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_> + 0x1b0
          );
    pBVar14 = (BoxArray *)
              phi.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&phi.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start[(long)pBVar20]->super_FabArray<amrex::FArrayBox>,
               0.0);
  }
  rhcc.
  super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  .
  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rhcc.
  super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  .
  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rhcc.
  super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  .
  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pBVar20 = pBVar26;
  pBVar25 = pBVar26;
  local_4b0 = pBVar26;
  if (local_4b4 != 0) {
    std::
    vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::resize(&rhcc.
              super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ,10);
    while (pBVar14 = pBVar26, pBVar25 = pBVar20, (long)pBVar26 <= lVar7) {
      uVar1._M_t.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (this->parent->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(long)pBVar26]._M_t;
      local_498 = pBVar26;
      std::__cxx11::string::string((string *)&mfi,"divu",(allocator *)&v_fine);
      bVar5 = amrex::AmrLevel::isStateVariable((string *)&mfi,&Divu_Type,&Divu);
      std::__cxx11::string::~string((string *)&mfi);
      if (!bVar5) {
        amrex::Error_host("Projection::initialSyncProject(): Divu not found");
      }
      pFVar2 = *(FabArray<amrex::FArrayBox> **)
                (*(long *)((long)uVar1._M_t.
                                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                 .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                          0x170) + 200 + (long)Divu_Type * 0xe0);
      pFVar10 = *(FabArray<amrex::FArrayBox> **)
                 (*(long *)((long)uVar1._M_t.
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                  .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                           0x170) + 0xd0 + (long)Divu_Type * 0xe0);
      amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>(pFVar2,false);
      amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>(pFVar10,false);
      RVar29 = amrex::StateData::prevTime
                         ((StateData *)
                          ((long)Divu_Type * 0xe0 +
                          *(long *)((long)uVar1._M_t.
                                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                          _M_head_impl + 0x170)));
      local_4a8 = amrex::StateData::curTime
                            ((StateData *)
                             ((long)Divu_Type * 0xe0 +
                             *(long *)((long)uVar1._M_t.
                                             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                             .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                             _M_head_impl + 0x170)));
      amrex::MFIter::MFIter(&mfi,&pFVar2->super_FabArrayBase,'\0');
      while (mfi.currentIndex < mfi.endIndex) {
        iVar6 = mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          iVar6 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[mfi.currentIndex];
        }
        (**(code **)(*(long *)uVar1._M_t.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xf0))
                  (RVar29,uVar1._M_t.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                   (pFVar10->m_fabs_v).
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar6],Divu_Type,0,0,1);
        piVar11 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar11 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi.currentIndex;
        }
        (**(code **)(*(long *)uVar1._M_t.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xf0))
                  (local_4a8,
                   uVar1._M_t.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                   (pFVar2->m_fabs_v).
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[*piVar11],Divu_Type,0,0,1);
        amrex::MFIter::operator++(&mfi);
      }
      amrex::MFIter::~MFIter(&mfi);
      puVar4 = rhcc.
               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this_02 = (MultiFab *)operator_new(0x180);
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      mfi.tile_size.vect[2] = 0;
      mfi.flags = '\0';
      mfi._29_3_ = 0;
      mfi.currentIndex = 0;
      mfi.beginIndex = 0;
      mfi.fabArray = (FabArrayBase *)0x0;
      mfi.tile_size.vect[0] = 0;
      mfi.tile_size.vect[1] = 0;
      amrex::MultiFab::MultiFab
                (this_02,(BoxArray *)
                         ((long)uVar1._M_t.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xd8
                         ),
                 (DistributionMapping *)
                 ((long)uVar1._M_t.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x140),1,1,
                 (MFInfo *)&mfi,
                 *(FabFactory<amrex::FArrayBox> **)
                  ((long)uVar1._M_t.
                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x218));
      pBVar20 = local_4b0;
      pMVar15 = puVar4[(long)local_498]._M_t.
                super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      puVar4[(long)local_498]._M_t.
      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = this_02;
      if (pMVar15 != (MultiFab *)0x0) {
        (**(code **)(*(long *)&(pMVar15->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))
                  ();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&mfi.tile_size);
      pBVar14 = local_498;
      pFVar2 = &(rhcc.
                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)local_498]._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                super_FabArray<amrex::FArrayBox>;
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>(pFVar2,0.0);
      pNVar9 = (NavierStokesBase *)
               __dynamic_cast((__uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               )(this->parent->amr_level).
                                super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                .
                                super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(long)pBVar14]._M_t,
                              &amrex::AmrLevel::typeinfo,&NavierStokesBase::typeinfo,0);
      pFVar10 = &NavierStokesBase::getDivCond(pNVar9,1,strt_time)->super_FabArray<amrex::FArrayBox>;
      this_03 = &NavierStokesBase::getDivCond(pNVar9,1,dt + strt_time)->
                 super_FabArray<amrex::FArrayBox>;
      amrex::MFIter::MFIter(&mfi,&pFVar2->super_FabArrayBase,true);
      while( true ) {
        if (mfi.endIndex <= mfi.currentIndex) break;
        amrex::MFIter::growntilebox(&local_3e0,&mfi,-1000000);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&v_fine,pFVar10,&mfi);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_3c0,this_03,&mfi);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_1f8,pFVar2,&mfi);
        lVar17 = (long)local_3e0.smallend.vect[1];
        lVar27 = (long)local_3e0.smallend.vect[2];
        lVar23 = (long)local_3e0.smallend.vect[0];
        lVar12 = (lVar17 - local_1f8.begin.y) * local_1f8.jstride * 8 +
                 (lVar27 - local_1f8.begin.z) * local_1f8.kstride * 8 + lVar23 * 8 +
                 (long)local_1f8.begin.x * -8 + (long)local_1f8.p;
        lVar18 = (lVar17 - v_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat
                           .m_op.m_bndryReg.m_loshft.vect[1]) *
                 v_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ * 8
                 + (lVar27 - v_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                             m_bat.m_op.m_bndryReg.m_loshft.vect[2]) *
                   v_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                   _4_8_ * 8 + lVar23 * 8 +
                 (long)v_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                       m_op.m_bndryReg.m_loshft.vect[0] * -8 +
                 (long)v_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase
        ;
        lVar23 = (lVar17 - _Stack_3a0._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl._4_4_) * local_3c0._8_8_ * 8 +
                 (lVar27 - local_398) * local_3c0._16_8_ * 8 + lVar23 * 8 +
                 (long)(int)_Stack_3a0._M_t.
                            super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                            .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                            _M_head_impl * -8 + local_3c0._0_8_;
        local_4a8 = (Real)(long)local_3e0.bigend.vect[2];
        for (; lVar13 = lVar17, lVar19 = lVar18, lVar21 = lVar23, lVar24 = lVar12,
            lVar27 <= (long)local_4a8; lVar27 = lVar27 + 1) {
          for (; lVar13 <= local_3e0.bigend.vect[1]; lVar13 = lVar13 + 1) {
            if (local_3e0.smallend.vect[0] <= local_3e0.bigend.vect[0]) {
              lVar22 = 0;
              do {
                *(double *)(lVar24 + lVar22 * 8) =
                     (*(double *)(lVar21 + lVar22 * 8) - *(double *)(lVar19 + lVar22 * 8)) *
                     (1.0 / dt);
                lVar22 = lVar22 + 1;
              } while ((local_3e0.bigend.vect[0] - local_3e0.smallend.vect[0]) + 1 != (int)lVar22);
            }
            lVar19 = lVar19 + v_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                              m_bat._0_8_ * 8;
            lVar21 = lVar21 + local_3c0._8_8_ * 8;
            lVar24 = lVar24 + local_1f8.jstride * 8;
          }
          lVar12 = lVar12 + local_1f8.kstride * 8;
          lVar18 = lVar18 + v_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                            m_bat.m_op._4_8_ * 8;
          lVar23 = lVar23 + local_3c0._16_8_ * 8;
        }
        amrex::MFIter::operator++(&mfi);
        pBVar20 = local_4b0;
      }
      amrex::MFIter::~MFIter(&mfi);
      if (this_03 != (FabArray<amrex::FArrayBox> *)0x0) {
        (*(this_03->super_FabArrayBase)._vptr_FabArrayBase[1])(this_03);
      }
      if (pFVar10 != (FabArray<amrex::FArrayBox> *)0x0) {
        (*(pFVar10->super_FabArrayBase)._vptr_FabArrayBase[1])(pFVar10);
      }
      pBVar26 = (BoxArray *)((long)&(local_498->m_bat).m_bat_type + 1);
    }
  }
  for (; (long)pBVar20 <= lVar7; pBVar20 = (BoxArray *)((long)&(pBVar20->m_bat).m_bat_type + 1)) {
    amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
              (&vel.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start[(long)pBVar20]->super_FabArray<amrex::FArrayBox>,
               1e+200,0,3);
    amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
              (*(FabArray<amrex::FArrayBox> **)
                (*(long *)&((this->LevelData).
                            super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                            super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)pBVar20]->state).
                           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_> +
                0xd0),1e+200,0,3);
    amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
              (&(local_4a0->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start[(long)pBVar20]->super_FabArray<amrex::FArrayBox>,
               1e+200);
  }
  for (; (long)pBVar25 <= lVar7; pBVar25 = (BoxArray *)((long)&(pBVar25->m_bat).m_bat_type + 1)) {
    this_01 = *(StateData **)
               &((this->LevelData).
                 super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                 super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)pBVar25]->state).
                super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>;
    fabarray_ = (FabArrayBase *)
                (this_01->new_data)._M_t.
                super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    pMVar15 = (this_01->old_data)._M_t.
              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
              super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    RVar29 = amrex::StateData::prevTime(this_01);
    local_4a8 = amrex::StateData::curTime
                          (*(StateData **)
                            &((this->LevelData).
                              super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                              super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[(long)pBVar25]->state).
                             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                          );
    amrex::MFIter::MFIter(&mfi,fabarray_,'\0');
    while (mfi.currentIndex < mfi.endIndex) {
      iVar6 = mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        iVar6 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[mfi.currentIndex];
      }
      pAVar3 = (this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
               .super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
               super__Vector_impl_data._M_start[(long)pBVar25];
      (*pAVar3->_vptr_AmrLevel[0x1e])
                (RVar29,pAVar3,
                 *(undefined8 *)
                  (*(long *)&(pMVar15->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                             super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                             ._M_impl + (long)iVar6 * 8),0,0,0,3);
      piVar11 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar11 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      pAVar3 = (this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
               .super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
               super__Vector_impl_data._M_start[(long)pBVar25];
      pBVar14 = (BoxArray *)0x0;
      (*pAVar3->_vptr_AmrLevel[0x1e])
                (local_4a8,pAVar3,
                 *(undefined8 *)
                  (*(long *)((long)&fabarray_[1].boxarray.m_bat.m_op.m_bndryReg + 0xc) +
                  (long)*piVar11 * 8),0,0,0,3);
      amrex::MFIter::operator++(&mfi);
    }
    amrex::MFIter::~MFIter(&mfi);
    ConvertUnew(this,vel.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[(long)pBVar25],
                *(MultiFab **)
                 (*(long *)&((this->LevelData).
                             super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                             super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[(long)pBVar25]->state).
                            super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                            super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                 + 0xd0),dt,pBVar14);
  }
  bVar5 = OutFlowBC::HasOutFlowBC(this->phys_bc);
  pMVar15 = (MultiFab *)CONCAT71((int7)((ulong)pBVar14 >> 8),local_4b4 == 0);
  uVar16 = extraout_RDX;
  pBVar14 = local_4b0;
  if ((bVar5 && local_4b4 != 0) && (do_outflow_bcs != 0)) {
    amrex::GetVecOfPtrs<amrex::MultiFab>
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mfi,&rhcc);
    pMVar15 = (MultiFab *)&vel;
    set_outflow_bcs(this,0x3ec,&phi,
                    (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pMVar15,
                    (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mfi,local_4a0,
                    local_4b8,f_lev,local_4b4);
    pBVar14 = local_4b0;
    std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
              ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mfi);
    uVar16 = extraout_RDX_00;
  }
  for (; (long)pBVar14 <= lVar7; pBVar14 = (BoxArray *)((long)&(pBVar14->m_bat).m_bat_type + 1)) {
    scaleVar(this,(local_4a0->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)pBVar14],(int)uVar16,pMVar15,(int)pBVar14);
    uVar16 = extraout_RDX_01;
  }
  pBVar14 = local_4b0;
  for (lVar12 = lVar7; (long)pBVar14 < lVar12; lVar12 = lVar12 + -1) {
    pMVar15 = vel.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12];
    v_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
         (_func_int **)0x1;
    v_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._12_8_ = 0;
    v_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._20_8_ = 0;
    v_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
    v_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ = 0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)&mfi,
               &(vel.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12 + -1]->super_FabArray<amrex::FArrayBox>).
                super_FabArrayBase.boxarray,
               &(vel.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12 + -1]->super_FabArray<amrex::FArrayBox>).
                super_FabArrayBase.distributionMap,3,1,(MFInfo *)&v_fine,
               (FabFactory<amrex::FArrayBox> *)
               ((this->LevelData).
                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
                super__Vector_impl_data._M_start[lVar12 + -1]->m_factory)._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&v_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                  m_bndryReg.m_typ);
    local_3c0._0_8_ = (BARef *)0x1;
    local_3a8 = (pointer)0x0;
    _Stack_3a0._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
         (tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          )(_Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            )0x0;
    local_3c0._8_8_ = (Ref *)0x0;
    local_3c0._16_8_ = (pointer)0x0;
    amrex::MultiFab::MultiFab
              (&v_fine,&(pMVar15->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
               &(pMVar15->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,3,1,
               (MFInfo *)local_3c0,
               (FabFactory<amrex::FArrayBox> *)
               ((this->LevelData).
                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
                super__Vector_impl_data._M_start[lVar12]->m_factory)._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3c0 + 0x10));
    amrex::MultiFab::Copy
              ((MultiFab *)&mfi,
               vel.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12 + -1],0,0,3,1);
    amrex::MultiFab::Copy
              (&v_fine,vel.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar12],0,0,3,1);
    pNVar9 = (NavierStokesBase *)
             __dynamic_cast((this->LevelData).
                            super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                            super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar12 + -1],
                            &amrex::AmrLevel::typeinfo,&NavierStokesBase::typeinfo);
    NavierStokesBase::average_down(pNVar9,&v_fine,(MultiFab *)&mfi,0,local_2b4);
    pBVar14 = local_4b0;
    amrex::MultiFab::Copy
              (vel.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12 + -1],(MultiFab *)&mfi,0,0,3,1);
    amrex::MultiFab::~MultiFab(&v_fine);
    amrex::MultiFab::~MultiFab((MultiFab *)&mfi);
  }
  pBVar20 = pBVar14;
  if (local_4b4 != 0) {
    for (; (long)pBVar20 <= lVar7; pBVar20 = (BoxArray *)((long)&(pBVar20->m_bat).m_bat_type + 1)) {
      amrex::MultiFab::mult
                (rhcc.
                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)pBVar20]._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,-1.0,0,1,0);
    }
  }
  amrex::GetVecOfPtrs<amrex::MultiFab>
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mfi,&rhcc);
  v_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ = 0;
  v_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
  v_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
  pMVar15 = (MultiFab *)&vel;
  doMLMGNodalProjection
            (this,local_4b8,(f_lev - local_4b8) + 1,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pMVar15,&phi,local_4a0
             ,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mfi,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&v_fine,proj_tol,
             proj_abs_tol,true,(MultiFab *)0x0,(MultiFab *)0x0,false);
  std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
            ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&v_fine);
  std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
            ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mfi);
  uVar16 = extraout_RDX_02;
  for (; pBVar20 = local_4b0, (long)pBVar14 <= lVar7;
      pBVar14 = (BoxArray *)((long)&(pBVar14->m_bat).m_bat_type + 1)) {
    rescaleVar(this,(local_4a0->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>)
                    .super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)pBVar14],(int)uVar16,pMVar15,
               (int)pBVar14);
    uVar16 = extraout_RDX_03;
  }
  for (; (long)pBVar20 <= lVar7; pBVar20 = (BoxArray *)((long)&(pBVar20->m_bat).m_bat_type + 1)) {
    amrex::MultiFab::Add
              (*(MultiFab **)
                (*(long *)&((this->LevelData).
                            super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                            super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)pBVar20]->state).
                           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_> +
                0x1a8),phi.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[(long)pBVar20],0,0,1,1);
  }
  if (verbose != 0) {
    dVar30 = amrex::ParallelDescriptor::second();
    poVar8 = amrex::OutStream();
    amrex::Print::Print((Print *)&mfi,poVar8);
    std::operator<<((ostream *)&mfi.tile_size,"Projection::initialSyncProject(): time: ");
    std::ostream::_M_insert<double>(dVar30 - dVar28);
    std::operator<<((ostream *)&mfi.tile_size,'\n');
    amrex::Print::~Print((Print *)&mfi);
  }
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::~vector(&rhcc.
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           );
  std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
            ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&phi);
  std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
            ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&vel);
  return;
}

Assistant:

void
Projection::initialSyncProject (int       c_lev,
                                const Vector<MultiFab*> sig,
                                Real      dt,
                                Real      strt_time,
                                int       have_divu)
{
    int lev;
    int f_lev = parent->finestLevel();

    if (verbose)
      amrex::Print() << "Projection::initialSyncProject(): levels = " << c_lev << " - " << f_lev << '\n';

    if (verbose && benchmarking) ParallelDescriptor::Barrier();

    const Real stime = ParallelDescriptor::second();

    //
    // Gather data.
    //
    Vector<MultiFab*> vel(maxlev, nullptr);
    Vector<MultiFab*> phi(maxlev, nullptr);

    for (lev = c_lev; lev <= f_lev; lev++)
    {
        vel[lev] = &(LevelData[lev]->get_new_data(State_Type));
        // phi points to P_old and we use it as a temporary to
        // store phi resulting from the nodal projection, AKA
        // the pressure increment
        phi[lev] = &(LevelData[lev]->get_old_data(Press_Type));
        phi[lev] -> setVal(0.0);
    }

    const Real dt_inv = 1./dt;

    //
    // Source term
    //
    Vector<std::unique_ptr<MultiFab> > rhcc;
    if (have_divu)
    {
        rhcc.resize(maxlev);

        //
        // Set up rhcc for manual project.
        //
        for (lev = c_lev; lev <= f_lev; lev++)
        {
            AmrLevel& amr_level = parent->getLevel(lev);

            int Divu_Type, Divu;
            if (!LevelData[c_lev]->isStateVariable("divu", Divu_Type, Divu))
                amrex::Error("Projection::initialSyncProject(): Divu not found");
            //
            // Make sure ghost cells are properly filled.
            //
            MultiFab& divu_new = amr_level.get_new_data(Divu_Type);
            MultiFab& divu_old = amr_level.get_old_data(Divu_Type);
            divu_new.FillBoundary();
            divu_old.FillBoundary();

            Real prev_time = amr_level.get_state_data(Divu_Type).prevTime();
            Real curr_time = amr_level.get_state_data(Divu_Type).curTime();

            for (MFIter mfi(divu_new); mfi.isValid(); ++mfi)
            {
                amr_level.setPhysBoundaryValues(divu_old[mfi],Divu_Type,prev_time,0,0,1);
                amr_level.setPhysBoundaryValues(divu_new[mfi],Divu_Type,curr_time,0,0,1);
            }

	    // Needed for set_outflow_bcs(). MLMG ignores rh ghost cells.
            const int nghost = 1;
            rhcc[lev].reset(new MultiFab(amr_level.boxArray(),
                            amr_level.DistributionMap(),
                            1,nghost,MFInfo(),amr_level.Factory()));
            MultiFab* rhcclev = rhcc[lev].get();
            rhcclev->setVal(0);

            NavierStokesBase* ns = dynamic_cast<NavierStokesBase*>(&parent->getLevel(lev));

            AMREX_ASSERT(!(ns == 0));

            std::unique_ptr<MultiFab> divu (ns->getDivCond(nghost,strt_time));
            std::unique_ptr<MultiFab> dsdt (ns->getDivCond(nghost,strt_time+dt));

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*rhcclev,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
               const Box& bx = mfi.growntilebox();
               const auto& du       = divu->array(mfi);
               const auto& dsdt_arr = dsdt->array(mfi);
               const auto& rhcc_arr = rhcclev->array(mfi);
               amrex::ParallelFor(bx, [du,dsdt_arr,rhcc_arr,dt_inv]
               AMREX_GPU_DEVICE (int i, int j, int k) noexcept
               {
                  rhcc_arr(i,j,k) = ( dsdt_arr(i,j,k) - du(i,j,k) ) * dt_inv;
               });
            }
        }
    }

    //
    // Set velocity bndry values to bogus values.
    //
    for (lev = c_lev; lev <= f_lev; lev++)
    {
        vel[lev]->setBndry(BogusValue,Xvel,AMREX_SPACEDIM);
        MultiFab &u_o = LevelData[lev]->get_old_data(State_Type);
        u_o.setBndry(BogusValue,Xvel,AMREX_SPACEDIM);
        sig[lev]->setBndry(BogusValue);
    }

    //
    // Convert velocities to accelerations (we always do this for the
    //  projections in these initial iterations).
    //
    for (lev = c_lev; lev <= f_lev; lev++)
    {
        MultiFab& S_old = LevelData[lev]->get_old_data(State_Type);
        MultiFab& S_new = LevelData[lev]->get_new_data(State_Type);

        Real prev_time = LevelData[lev]->get_state_data(State_Type).prevTime();
        Real curr_time = LevelData[lev]->get_state_data(State_Type).curTime();

        for (MFIter mfi(S_new); mfi.isValid(); ++mfi)
        {
            LevelData[lev]->setPhysBoundaryValues(S_old[mfi],State_Type,prev_time,Xvel,Xvel,AMREX_SPACEDIM);
            LevelData[lev]->setPhysBoundaryValues(S_new[mfi],State_Type,curr_time,Xvel,Xvel,AMREX_SPACEDIM);
        }

        MultiFab& u_o = LevelData[lev]->get_old_data(State_Type);
        ConvertUnew(*vel[lev], u_o, dt, LevelData[lev]->boxArray());
    }

    if (OutFlowBC::HasOutFlowBC(phys_bc) && have_divu && do_outflow_bcs) {
        set_outflow_bcs(INITIAL_SYNC,phi,vel,
                        amrex::GetVecOfPtrs(rhcc),
                        sig,c_lev,f_lev,have_divu);
    }

    //
    // Scale initial sync projection variables.
    //
    for (lev = c_lev; lev <= f_lev; lev++)
    {
        scaleVar(sig[lev],1,vel[lev],lev);

        if (have_divu && parent->Geom(0).IsRZ())
          radMultScal(lev,*(rhcc[lev]));
    }

    for (lev = f_lev; lev >= c_lev+1; lev--) {
      const BoxArray& crse_grids = vel[lev-1]->boxArray();
      const BoxArray& fine_grids = vel[lev  ]->boxArray();
      const DistributionMapping& crse_dmap = vel[lev-1]->DistributionMap();
      const DistributionMapping& fine_dmap = vel[lev  ]->DistributionMap();

      MultiFab v_crse(crse_grids, crse_dmap, AMREX_SPACEDIM, 1, MFInfo(), LevelData[lev-1]->Factory());
      MultiFab v_fine(fine_grids, fine_dmap, AMREX_SPACEDIM, 1, MFInfo(), LevelData[lev]->Factory());

      MultiFab::Copy(v_crse, *vel[lev-1], 0, 0, AMREX_SPACEDIM, 1);
      MultiFab::Copy(v_fine, *vel[lev  ], 0, 0, AMREX_SPACEDIM, 1);

      NavierStokesBase* ns = dynamic_cast<NavierStokesBase*>(LevelData[lev-1]);
      ns->average_down(v_fine, v_crse, 0, v_crse.nComp());

      MultiFab::Copy(*vel[lev-1], v_crse, 0, 0, AMREX_SPACEDIM, 1);
    }

    //
    // Project.
    //
    if (have_divu) {
        for (lev = c_lev; lev <= f_lev; lev++)
        {
            rhcc[lev]->mult(-1.0,0,1);
        }
    }

    bool increment_gp = true;
    doMLMGNodalProjection(c_lev, f_lev-c_lev+1, vel, phi, sig,
                          amrex::GetVecOfPtrs(rhcc),
                          {}, proj_tol, proj_abs_tol, increment_gp, 0, 0);

    //
    // Unscale initial sync projection variables.
    //
    for (lev = c_lev; lev <= f_lev; lev++)
        rescaleVar(sig[lev],1,vel[lev],lev);

    //
    // Add correction at coarse and fine levels.
    // Only update new. NSB::resetState will take care of setting
    // old = new
    //
    for (lev = c_lev; lev <= f_lev; lev++)
    {
        MultiFab& P_new = LevelData[lev]->get_new_data(Press_Type);
        MultiFab::Add(P_new, *phi[lev], 0, 0, 1, 1);
    }

    //
    // Grad(P_new) incremented in doMLMGNodalProjection.
    //

    if (verbose)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - stime;

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

        amrex::Print() << "Projection::initialSyncProject(): time: " << run_time << '\n';
    }
}